

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall
AnalogConsumer::AnalogConsumer
          (AnalogConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  HighFreqDataType *in_RSI;
  undefined8 *in_RDI;
  HighFreqDataType *in_stack_fffffffffffffef0;
  allocator_type *__a;
  HFParsingInfo *__n;
  HFParsingInfo *this_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  consumer_queue_filter in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  HighFreqDataType *in_stack_ffffffffffffffc8;
  HFSubConsumer *in_stack_ffffffffffffffd0;
  
  HighFreqDataType::HighFreqDataType
            (in_RSI,(HighFreqDataType *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  HFSubConsumer::HFSubConsumer
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffffef0);
  *in_RDI = &PTR__AnalogConsumer_00375228;
  __a = (allocator_type *)(in_RDI + 0x7a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ce03a);
  __n = (HFParsingInfo *)(in_RDI + 0x7d);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x1ce050);
  this_00 = (HFParsingInfo *)(in_RDI + 0x80);
  HighFreqDataType::getByteSize(in_RSI);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1ce08a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)__n,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1ce0aa);
  HFParsingInfo::HFParsingInfo(this_00,__n);
  *(undefined4 *)(in_RDI + 0x16) = 3;
  return;
}

Assistant:

AnalogConsumer::AnalogConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize),
      temp_buffer(hf.getByteSize()),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}